

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass.c
# Opt level: O0

void first_pass_tile(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,
                    BLOCK_SIZE fp_block_size)

{
  byte bVar1;
  byte in_CL;
  int *in_RDX;
  int mi_row;
  int unit_height_log2;
  int unit_height;
  TileInfo *tile;
  BLOCK_SIZE in_stack_0000012b;
  int in_stack_0000012c;
  TileDataEnc *in_stack_00000130;
  ThreadData_conflict *in_stack_00000138;
  AV1_COMP *in_stack_00000140;
  int local_34;
  
  bVar1 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_CL];
  for (local_34 = *in_RDX; local_34 < in_RDX[1]; local_34 = (uint)bVar1 + local_34) {
    av1_first_pass_row(in_stack_00000140,in_stack_00000138,in_stack_00000130,in_stack_0000012c,
                       in_stack_0000012b);
  }
  return;
}

Assistant:

static void first_pass_tile(AV1_COMP *cpi, ThreadData *td,
                            TileDataEnc *tile_data,
                            const BLOCK_SIZE fp_block_size) {
  TileInfo *tile = &tile_data->tile_info;
  const int unit_height = mi_size_high[fp_block_size];
  const int unit_height_log2 = mi_size_high_log2[fp_block_size];
  for (int mi_row = tile->mi_row_start; mi_row < tile->mi_row_end;
       mi_row += unit_height) {
    av1_first_pass_row(cpi, td, tile_data, mi_row >> unit_height_log2,
                       fp_block_size);
  }
}